

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall libtorrent::dht::observer::set_target(observer *this,endpoint *ep)

{
  byte bVar1;
  ushort uVar2;
  rep rVar3;
  bool bVar4;
  address local_48;
  undefined1 local_28 [24];
  
  rVar3 = ::std::chrono::_V2::system_clock::now();
  (this->m_sent).__d.__r = rVar3;
  uVar2 = (ep->impl_).data_.v4.sin_port;
  this->m_port = uVar2 << 8 | uVar2 >> 8;
  bVar1 = (this->flags).m_val;
  if ((ep->impl_).data_.base.sa_family == 2) {
    (this->flags).m_val = bVar1 & 0xdf;
    bVar4 = (ep->impl_).data_.base.sa_family != 2;
    if (bVar4) {
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
      local_48.ipv6_address_.scope_id_ = (unsigned_long)(ep->impl_).data_.v6.sin6_scope_id;
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)(ep->impl_).data_.v4.sin_addr.s_addr;
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_48.ipv6_address_.scope_id_ = 0;
    }
    local_48.type_ = (anon_enum_32)bVar4;
    boost::asio::ip::address::to_v4((address *)local_28);
    *(undefined4 *)(this->m_addr).v4._M_elems = local_28._0_4_;
  }
  else {
    (this->flags).m_val = bVar1 | 0x20;
    bVar4 = (ep->impl_).data_.base.sa_family != 2;
    if (bVar4) {
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
      local_48.ipv6_address_.scope_id_ = (unsigned_long)(ep->impl_).data_.v6.sin6_scope_id;
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_48.ipv4_address_.addr_.s_addr = (in4_addr_type)(ep->impl_).data_.v4.sin_addr.s_addr;
      local_48.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_48.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_48.ipv6_address_.scope_id_ = 0;
    }
    local_48.type_ = (anon_enum_32)bVar4;
    boost::asio::ip::address::to_v6((address_v6 *)local_28,&local_48);
    *(ulong *)&this->m_addr = CONCAT44(local_28._4_4_,local_28._0_4_);
    *(undefined8 *)((long)&this->m_addr + 8) = local_28._8_8_;
  }
  return;
}

Assistant:

void observer::set_target(udp::endpoint const& ep)
{
	m_sent = clock_type::now();

	m_port = ep.port();
	if (aux::is_v6(ep))
	{
		flags |= flag_ipv6_address;
		m_addr.v6 = ep.address().to_v6().to_bytes();
	}
	else
	{
		flags &= ~flag_ipv6_address;
		m_addr.v4 = ep.address().to_v4().to_bytes();
	}
}